

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  byte bVar1;
  DisassemblerMode DVar2;
  VectorExtensionType VVar3;
  uint64_t uVar4;
  short sVar5;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  byte bVar12;
  uint8_t uVar13;
  ushort uVar14;
  short sVar16;
  byte bVar17;
  uint8_t uVar18;
  uint64_t uVar19;
  ulong uVar20;
  ushort uVar21;
  uint16_t attrMask;
  bool bVar22;
  uint8_t byte;
  uint16_t instructionID;
  uint8_t byte1_3;
  uint8_t nextByte;
  uint8_t byte1;
  uint8_t byte1_1;
  uint8_t byte1_2;
  uint8_t byte2;
  uint16_t instructionIDWithOpsize;
  byte local_50;
  byte local_4f;
  ushort local_4e;
  byte local_4b;
  byte local_4a;
  byte local_49 [6];
  byte local_43;
  byte local_42;
  byte local_41;
  undefined8 local_40;
  ushort local_34;
  ushort local_32;
  ushort uVar15;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_50 = 0;
  local_40 = 0;
  local_49[1] = 0;
  local_49[2] = 0;
  local_49[3] = 0;
  local_49[4] = 0;
  do {
    if (mode == MODE_64BIT) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      uVar10 = insn->readerCursor;
      uVar19 = uVar10 + 1;
      insn->readerCursor = uVar19;
      if ((local_50 & 0xf0) == 0x40) {
        while( true ) {
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,uVar19);
          if (iVar7 != 0) {
            return -1;
          }
          if ((local_50 & 0xf0) != 0x40) break;
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,insn->readerCursor);
          uVar19 = insn->readerCursor;
          if (iVar7 == 0) {
            uVar19 = uVar19 + 1;
            insn->readerCursor = uVar19;
          }
        }
        if ((((local_50 - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(local_50 - 0x2e) & 0x3f) & 1) != 0)) ||
            ((local_50 - 0xf0 < 4 && (local_50 - 0xf0 != 1)))) || (local_50 == 0x26))
        goto LAB_0019f9da;
        uVar10 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar10;
    }
LAB_0019f9da:
    uVar19 = insn->readerCursor;
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,uVar19);
    if (iVar7 != 0) break;
    uVar4 = insn->readerCursor;
    uVar10 = uVar4 + 1;
    insn->readerCursor = uVar10;
    if (((local_50 & 0xfe) == 0xf2 && uVar4 == insn->startLocation) &&
       (iVar7 = (*insn->reader)((reader_info *)insn->readerArg,local_49,uVar10), iVar7 == 0)) {
      if ((local_50 & 0xfe) == 0xf2) {
        if (((local_49[0] == 0xf0) || ((local_49[0] & 0xfe) == 0x86)) ||
           ((local_49[0] & 0xfffffff8) == 0x90)) {
          insn->xAcquireRelease = true;
        }
        if (((local_50 == 0xf3) && (uVar8 = local_49[0] - 0x88, uVar8 < 0x40)) &&
           ((0xc000000000000003U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
          insn->xAcquireRelease = true;
        }
      }
      if ((insn->mode == MODE_64BIT) && ((local_49[0] & 0xf0) == 0x40)) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,local_49,insn->readerCursor);
        if (iVar7 != 0) {
          return -1;
        }
        uVar10 = insn->readerCursor + 1;
        insn->readerCursor = uVar10;
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,local_49,uVar10);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    uVar8 = (uint)local_50;
    uVar9 = (uint)local_50;
    if (uVar8 < 0x3e) {
      if (uVar8 == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
        insn->prefixPresent[0x2e] = '\0';
        insn->prefixPresent[0x36] = '\0';
        insn->prefixPresent[0x3e] = '\0';
        insn->prefixPresent[100] = '\0';
        insn->prefixPresent[0x65] = '\0';
        insn->prefixPresent[0x26] = '\x01';
        insn->prefixLocations[0x26] = uVar19;
        insn->prefix1 = '&';
      }
      else if (uVar9 == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
        insn->prefixPresent[0x36] = '\0';
        insn->prefixPresent[0x3e] = '\0';
        insn->prefixPresent[0x26] = '\0';
        insn->prefixPresent[100] = '\0';
        insn->prefixPresent[0x65] = '\0';
        insn->prefixPresent[0x2e] = '\x01';
        insn->prefixLocations[0x2e] = uVar19;
        insn->prefix1 = '.';
      }
      else {
        if (uVar9 != 0x36) break;
        insn->segmentOverride = SEG_OVERRIDE_SS;
        insn->prefixPresent[0x2e] = '\0';
        insn->prefixPresent[0x3e] = '\0';
        insn->prefixPresent[0x26] = '\0';
        insn->prefixPresent[100] = '\0';
        insn->prefixPresent[0x65] = '\0';
        insn->prefixPresent[0x36] = '\x01';
        insn->prefixLocations[0x36] = uVar19;
        insn->prefix1 = '6';
      }
    }
    else {
      if (uVar8 - 100 < 4) {
        iVar7 = (*(code *)(&DAT_001ec390 + *(int *)(&DAT_001ec390 + (ulong)(uVar8 - 100) * 4)))();
        return iVar7;
      }
      if ((uVar9 - 0xf0 < 4) && (uVar9 - 0xf0 != 1)) {
        insn->prefixPresent[0xf2] = '\0';
        insn->prefixPresent[0xf3] = '\0';
        insn->prefixPresent[0xf0] = '\0';
        insn->prefixPresent[local_50] = '\x01';
        insn->prefixLocations[local_50] = uVar19;
        insn->prefix0 = local_50;
      }
      else {
        if (uVar9 != 0x3e) break;
        insn->segmentOverride = SEG_OVERRIDE_DS;
        insn->prefixPresent[0x2e] = '\0';
        insn->prefixPresent[0x36] = '\0';
        insn->prefixPresent[0x26] = '\0';
        insn->prefixPresent[100] = '\0';
        insn->prefixPresent[0x65] = '\0';
        insn->prefixPresent[0x3e] = '\x01';
        insn->prefixLocations[0x3e] = uVar19;
        insn->prefix1 = '>';
      }
    }
    mode = insn->mode;
  } while( true );
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (local_50 < 0xc4) {
    if (local_50 == 0x62) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4a,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      uVar10 = insn->readerCursor;
      uVar19 = uVar10 + 1;
      insn->readerCursor = uVar19;
      if ((local_4a & 0xc) == 0 && (0xbf < local_4a || insn->mode == MODE_64BIT)) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_41,uVar19);
        if (iVar7 != 0) {
          return -1;
        }
        if ((local_41 & 4) == 0) {
          uVar10 = insn->readerCursor;
          uVar19 = uVar10 - 2;
          insn->readerCursor = uVar19;
          insn->necessaryPrefixLocation = uVar10 - 4;
          if (insn->vectorExtensionType != TYPE_EVEX) goto LAB_001a01c0;
        }
        else {
          insn->vectorExtensionType = TYPE_EVEX;
          uVar19 = insn->readerCursor;
        }
        insn->vectorExtensionPrefix[0] = local_50;
        insn->vectorExtensionPrefix[1] = local_4a;
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                uVar19);
        if (iVar7 != 0) {
          return -1;
        }
        uVar19 = insn->readerCursor + 1;
        insn->readerCursor = uVar19;
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 3,
                                uVar19);
        if (iVar7 != 0) {
          return -1;
        }
        goto LAB_001a009f;
      }
      insn->readerCursor = uVar10 - 1;
      goto LAB_001a01c0;
    }
    if (local_50 != 0x8f) goto LAB_0019fde4;
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,local_49 + 5,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    if ((local_49[5] & 0x38) == 0) {
      uVar10 = insn->readerCursor;
      uVar19 = uVar10 - 1;
      insn->readerCursor = uVar19;
      insn->necessaryPrefixLocation = uVar10 - 2;
      if (insn->vectorExtensionType != TYPE_XOP) goto LAB_001a01c0;
    }
    else {
      insn->vectorExtensionType = TYPE_XOP;
      uVar19 = insn->readerCursor;
      insn->necessaryPrefixLocation = uVar19 - 1;
    }
    insn->vectorExtensionPrefix[0] = local_50;
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar19);
    uVar19 = insn->readerCursor;
    if (iVar7 == 0) {
      uVar19 = uVar19 + 1;
      insn->readerCursor = uVar19;
    }
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,uVar19);
    if (iVar7 == 0) {
      insn->readerCursor = insn->readerCursor + 1;
    }
    bVar17 = insn->vectorExtensionPrefix[2];
    if (insn->mode == MODE_64BIT) {
      insn->rexPrefix = (byte)~insn->vectorExtensionPrefix[1] >> 5 | bVar17 >> 4 & 8 | 0x40;
    }
    bVar12 = 1;
    if ((bVar17 & 3) != 1) {
      bVar12 = (byte)local_40;
    }
LAB_001a01c5:
    bVar17 = (byte)local_49._1_4_;
  }
  else {
    if (local_50 == 0xc4) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_42,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      if ((insn->mode == MODE_64BIT) || (0xbf < local_42)) {
        insn->vectorExtensionType = TYPE_VEX_3B;
        uVar19 = insn->readerCursor;
        insn->necessaryPrefixLocation = uVar19 - 1;
      }
      else {
        uVar10 = insn->readerCursor;
        uVar19 = uVar10 - 1;
        insn->readerCursor = uVar19;
        insn->necessaryPrefixLocation = uVar10 - 2;
        if (insn->vectorExtensionType != TYPE_VEX_3B) goto LAB_001a01c0;
      }
      insn->vectorExtensionPrefix[0] = local_50;
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar19)
      ;
      uVar19 = insn->readerCursor;
      if (iVar7 == 0) {
        uVar19 = uVar19 + 1;
        insn->readerCursor = uVar19;
      }
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,uVar19)
      ;
      if (iVar7 == 0) {
LAB_001a009f:
        insn->readerCursor = insn->readerCursor + 1;
      }
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix =
             (byte)~insn->vectorExtensionPrefix[1] >> 5 | insn->vectorExtensionPrefix[2] >> 4 & 8 |
             0x40;
      }
LAB_001a01c0:
      bVar12 = (byte)local_40;
      goto LAB_001a01c5;
    }
    if (local_50 == 0xc5) {
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_43,insn->readerCursor);
      if (iVar7 != 0) {
        return -1;
      }
      if ((insn->mode == MODE_64BIT) || (0xbf < local_43)) {
        insn->vectorExtensionType = TYPE_VEX_2B;
        uVar19 = insn->readerCursor;
      }
      else {
        uVar19 = insn->readerCursor - 1;
        insn->readerCursor = uVar19;
        if (insn->vectorExtensionType != TYPE_VEX_2B) goto LAB_001a01c0;
      }
      insn->vectorExtensionPrefix[0] = local_50;
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,uVar19)
      ;
      if (iVar7 == 0) {
        insn->readerCursor = insn->readerCursor + 1;
      }
      bVar1 = insn->vectorExtensionPrefix[1];
      bVar17 = (byte)local_49._1_4_;
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix = (byte)~bVar1 >> 5 & 4 | 0x40;
      }
      bVar12 = 1;
      if ((bVar1 & 3) != 1) {
        bVar12 = (byte)local_40;
      }
    }
    else {
LAB_0019fde4:
      bVar17 = (byte)local_49._1_4_;
      if ((insn->mode == MODE_64BIT) && ((local_50 & 0xf0) == 0x40)) {
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,insn->readerCursor);
        if (iVar7 != 0) {
          return -1;
        }
        while ((local_4b & 0xf0) == 0x40) {
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,insn->readerCursor);
          uVar19 = insn->readerCursor;
          if (iVar7 == 0) {
            uVar19 = uVar19 + 1;
            insn->readerCursor = uVar19;
          }
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4b,uVar19);
          if (iVar7 != 0) {
            return -1;
          }
        }
        insn->rexPrefix = local_50;
        insn->necessaryPrefixLocation = insn->readerCursor - 2;
        goto LAB_001a01c0;
      }
      uVar19 = insn->readerCursor;
      insn->readerCursor = uVar19 - 1;
      insn->necessaryPrefixLocation = uVar19 - 2;
      bVar12 = (byte)local_40;
    }
  }
  DVar2 = insn->mode;
  if (DVar2 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar18 = (~bVar17 & 1) * '\x04' + '\x04';
      uVar6 = '\x04';
      uVar13 = '\x04';
      goto LAB_001a020d;
    }
    uVar13 = (~bVar12 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar13;
    insn->addressSize = (~bVar17 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar13;
    insn->immediateSize = uVar13;
    if (insn->rexPrefix == 0) {
      uVar13 = (~bVar12 & 1) * '\x04' + '\x04';
    }
LAB_001a021f:
    insn->immSize = uVar13;
  }
  else {
    if (DVar2 == MODE_32BIT) {
      uVar13 = (~bVar12 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar13;
      bVar17 = ~bVar17;
LAB_001a0203:
      uVar18 = (bVar17 & 1) * '\x02' + '\x02';
      uVar6 = uVar18;
LAB_001a020d:
      insn->addressSize = uVar18;
      insn->displacementSize = uVar6;
      insn->immediateSize = uVar13;
      goto LAB_001a021f;
    }
    if (DVar2 == MODE_16BIT) {
      uVar13 = (bVar12 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar13;
      goto LAB_001a0203;
    }
  }
  insn->opcodeType = ONEBYTE;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_001a024e_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_001a02d9_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar17 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar17 != 3) {
      if (bVar17 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_001a02d9_caseD_2;
      }
      if (bVar17 != 1) {
        return -1;
      }
      goto switchD_001a024e_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_001a02d9_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_001a02d9_caseD_1;
    case 2:
switchD_001a02d9_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_001a02d9_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar17 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar17 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar17 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar17 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,insn->readerCursor);
    if (iVar7 != 0) {
      return -1;
    }
    uVar19 = insn->readerCursor + 1;
    insn->readerCursor = uVar19;
    insn->firstByte = local_4f;
    if (local_4f == 0xf) {
      insn->twoByteEscape = '\x0f';
      iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,uVar19);
      if (iVar7 != 0) {
        return -1;
      }
      uVar19 = insn->readerCursor + 1;
      insn->readerCursor = uVar19;
      if (local_4f < 0x38) {
        if (local_4f == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if (local_4f != 0xf) goto LAB_001a0a4c;
          iVar7 = readModRM(insn);
          if (iVar7 != 0) {
            return -1;
          }
          iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,insn->readerCursor);
          if (iVar7 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if (local_4f == 0x3a) {
        insn->threeByteEscape = ':';
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,uVar19);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (local_4f == 0x38) {
        insn->threeByteEscape = '8';
        iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,uVar19);
        if (iVar7 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_001a0a4c:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = local_4f;
    goto LAB_001a049b;
  }
  iVar7 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,insn->readerCursor);
  if (iVar7 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_001a049b:
  VVar3 = insn->vectorExtensionType;
  bVar22 = insn->mode == MODE_64BIT;
  if (VVar3 == TYPE_NO_VEX_XOP) {
    if (((insn->mode == MODE_16BIT) || (insn->prefixPresent[0x66] != '\x01')) ||
       (insn->prefixLocations[0x66] != insn->necessaryPrefixLocation)) {
      uVar19 = insn->necessaryPrefixLocation;
      if ((insn->prefixPresent[0x67] == '\x01') && (insn->prefixLocations[0x67] == uVar19)) {
        uVar21 = bVar22 | 0x20;
      }
      else if ((insn->prefixPresent[0xf3] == '\x01') && (insn->prefixLocations[0xf3] == uVar19)) {
        uVar21 = bVar22 | 2;
      }
      else {
        uVar21 = (ushort)bVar22;
        if ((insn->prefixPresent[0xf2] == '\x01') && (insn->prefixLocations[0xf2] == uVar19)) {
          uVar21 = bVar22 | 4;
        }
      }
    }
    else {
      uVar21 = bVar22 | 0x10;
    }
  }
  else {
    uVar21 = 0x40;
    if (VVar3 == TYPE_EVEX) {
      uVar21 = 0x100;
    }
    uVar21 = bVar22 | uVar21;
    if (VVar3 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar21 = uVar21 | 0x10;
        break;
      case 2:
        uVar21 = uVar21 | 2;
        break;
      case 3:
        uVar21 = uVar21 | 4;
      }
      bVar17 = insn->vectorExtensionPrefix[3];
      if ((char)bVar17 < '\0') {
        uVar21 = uVar21 + 0x1000;
      }
      sVar16 = (bVar17 & 0x10) * 0x200;
      sVar5 = sVar16 + 0x800;
      if ((bVar17 & 7) == 0) {
        sVar5 = sVar16;
      }
      uVar21 = (bVar17 & 0x60) << 4 | sVar5 + uVar21;
    }
    else {
      if (VVar3 == TYPE_VEX_2B) {
        bVar17 = insn->vectorExtensionPrefix[1];
        uVar15 = (ushort)bVar17;
        uVar14 = (ushort)bVar17;
        switch(bVar17 & 3) {
        case 1:
          goto switchD_001a056a_caseD_1;
        case 2:
          goto switchD_001a056a_caseD_2;
        case 3:
          goto switchD_001a056a_caseD_3;
        }
      }
      else if (VVar3 == TYPE_XOP) {
        bVar17 = insn->vectorExtensionPrefix[2];
        uVar15 = (ushort)bVar17;
        uVar14 = (ushort)bVar17;
        switch(bVar17 & 3) {
        case 1:
          goto switchD_001a056a_caseD_1;
        case 2:
          goto switchD_001a056a_caseD_2;
        case 3:
          goto switchD_001a056a_caseD_3;
        }
      }
      else {
        if (VVar3 != TYPE_VEX_3B) {
          return -1;
        }
        bVar17 = insn->vectorExtensionPrefix[2];
        uVar15 = (ushort)bVar17;
        uVar14 = (ushort)bVar17;
        switch(bVar17 & 3) {
        case 1:
switchD_001a056a_caseD_1:
          uVar14 = uVar15;
          uVar21 = uVar21 | 0x10;
          break;
        case 2:
switchD_001a056a_caseD_2:
          uVar14 = uVar15;
          uVar21 = uVar21 | 2;
          break;
        case 3:
switchD_001a056a_caseD_3:
          uVar14 = uVar15;
          uVar21 = uVar21 | 4;
        }
      }
      uVar21 = uVar21 | (uVar14 & 4) << 5;
    }
  }
  attrMask = uVar21 | insn->rexPrefix & 8;
  iVar7 = getIDWithAttrMask(&local_4e,insn,attrMask);
  if (iVar7 != 0) {
    return -1;
  }
  if (insn->mode == MODE_16BIT) {
    if ((insn->opcode == 0xe3) && (x86DisassemblerInstrSpecifiers[local_4e].operands == 0x9c)) {
      attrMask = attrMask ^ 0x20;
      iVar7 = getIDWithAttrMask(&local_4e,insn,attrMask);
      if (iVar7 != 0) {
        return -1;
      }
      if (insn->mode != MODE_16BIT) goto LAB_001a068d;
    }
    if ((attrMask & 0x10) == 0) goto LAB_001a06a2;
LAB_001a0731:
    if (((insn->opcodeType == ONEBYTE) && (insn->opcode == 0x90)) && ((insn->rexPrefix & 1) != 0)) {
      insn->opcode = 0x91;
      iVar7 = getIDWithAttrMask(&local_34,insn,attrMask);
      if (iVar7 == 0) {
        local_4e = local_34;
      }
      insn->opcode = 0x90;
      insn->instructionID = local_4e;
      insn->spec = x86DisassemblerInstrSpecifiers + local_4e;
    }
    else {
      insn->instructionID = local_4e;
      insn->spec = x86DisassemblerInstrSpecifiers + local_4e;
    }
  }
  else {
LAB_001a068d:
    if ((insn->prefixPresent[0x66] == '\0') || ((attrMask & 0x10) != 0)) goto LAB_001a0731;
LAB_001a06a2:
    iVar7 = getIDWithAttrMask(&local_32,insn,attrMask | 0x10);
    if ((iVar7 == 0) &&
       ((x86_16_bit_eq_lookup[local_4e] != 0 &&
        (uVar8 = x86_16_bit_eq_lookup[local_4e] - 1, uVar11 = (ulong)uVar8, uVar8 < 0x381)))) {
      uVar20 = (ulong)local_32;
      do {
        if (x86_16_bit_eq_tbl[uVar11].first != local_4e) break;
        if (x86_16_bit_eq_tbl[uVar11].second == local_32) {
          if ((bool)insn->prefixPresent[0x66] != (insn->mode == MODE_16BIT)) {
            insn->instructionID = local_32;
            local_4e = local_32;
            goto LAB_001a06d6;
          }
          break;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x381);
    }
    insn->instructionID = local_4e;
    uVar20 = (ulong)local_4e;
LAB_001a06d6:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar20;
  }
  if (local_4e == 0) {
    return -1;
  }
  if (insn->prefixPresent[0xf0] == '\0') goto LAB_001a0aba;
  uVar8 = (uint)local_4e;
  if (local_4e < 0x380) {
    if (uVar8 == 0x132 || local_4e < 0x132) {
      if (((local_4e - 0x21 < 0x35) &&
          ((0x1c01c0181c0e07U >> ((ulong)(local_4e - 0x21) & 0x3f) & 1) != 0)) ||
         ((local_4e - 0xac < 0x1d && ((0x181c0e07U >> (local_4e - 0xac & 0x1f) & 1) != 0))))
      goto LAB_001a0aba;
      uVar8 = uVar8 - 0x5f;
      if (0xd < uVar8) {
        return -1;
      }
      uVar9 = 0x3007;
    }
    else {
      if (((local_4e - 0x133 < 0x22) &&
          ((0x333333333U >> ((ulong)(local_4e - 0x133) & 0x3f) & 1) != 0)) ||
         ((local_4e - 0x28e < 0xd && ((0x1551U >> (local_4e - 0x28e & 0x1f) & 1) != 0))))
      goto LAB_001a0aba;
      uVar8 = uVar8 - 0x23b;
      if (7 < uVar8) {
        return -1;
      }
      uVar9 = 0xd5;
    }
  }
  else if (uVar8 == 0x9cf || local_4e < 0x9cf) {
    if (((local_4e - 0x70e < 0x3e) &&
        ((0x3c0e550000000055U >> ((ulong)(local_4e - 0x70e) & 0x3f) & 1) != 0)) ||
       ((local_4e - 0x380 < 0xd && ((0x1551U >> (local_4e - 0x380 & 0x1f) & 1) != 0))))
    goto LAB_001a0aba;
    uVar8 = uVar8 - 0x752;
    if (10 < uVar8) {
      return -1;
    }
    uVar9 = 0x607;
  }
  else {
    if (((local_4e - 0x1829 < 0x3d) &&
        ((0x181c0e0700148855U >> ((ulong)(local_4e - 0x1829) & 0x3f) & 1) != 0)) ||
       ((local_4e - 0x9d0 < 0x1d && ((0x181c0e07U >> (local_4e - 0x9d0 & 0x1f) & 1) != 0))))
    goto LAB_001a0aba;
    uVar8 = uVar8 - 0xad3;
    if (0x1c < uVar8) {
      return -1;
    }
    uVar9 = 0x181c0e07;
  }
  if ((uVar9 >> (uVar8 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_001a0aba:
  iVar7 = readOperands(insn);
  if (iVar7 != 0) {
    return -1;
  }
  uVar11 = insn->readerCursor - insn->startLocation;
  insn->length = uVar11;
  if (uVar11 < 0x10) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    return 0;
  }
  return -1;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			invalidPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}